

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O3

void arg_dbl_errorfn(arg_dbl *parent,FILE *fp,int errorcode,char *argval,char *progname)

{
  char *shortopts;
  char *longopts;
  char *datatype;
  char *pcVar1;
  
  shortopts = (parent->hdr).shortopts;
  longopts = (parent->hdr).longopts;
  datatype = (parent->hdr).datatype;
  pcVar1 = "";
  if (argval != (char *)0x0) {
    pcVar1 = argval;
  }
  fprintf((FILE *)fp,"%s: ",progname);
  if (errorcode == 5) {
    fprintf((FILE *)fp,"invalid argument \"%s\" to option ",pcVar1);
  }
  else if (errorcode == 2) {
    fputs("excess option ",(FILE *)fp);
    datatype = pcVar1;
  }
  else {
    if (errorcode != 1) {
      return;
    }
    fputs("missing option ",(FILE *)fp);
  }
  arg_print_option(fp,shortopts,longopts,datatype,"\n");
  return;
}

Assistant:

static void arg_dbl_errorfn(
	struct arg_dbl * parent,
	FILE * fp,
	int errorcode,
	const char * argval,
	const char * progname) {
	const char * shortopts = parent->hdr.shortopts;
	const char * longopts  = parent->hdr.longopts;
	const char * datatype  = parent->hdr.datatype;

	/* make argval NULL safe */
	argval = argval ? argval : "";

	fprintf(fp, "%s: ", progname);

	switch (errorcode) {
		case EMINCOUNT:
			fputs("missing option ", fp);
			arg_print_option(fp, shortopts, longopts, datatype, "\n");
			break;

		case EMAXCOUNT:
			fputs("excess option ", fp);
			arg_print_option(fp, shortopts, longopts, argval, "\n");
			break;

		case EBADDOUBLE:
			fprintf(fp, "invalid argument \"%s\" to option ", argval);
			arg_print_option(fp, shortopts, longopts, datatype, "\n");
			break;
	}
}